

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_array_defs.h
# Opt level: O2

int __thiscall
ON_SimpleArray<ON_ClippingPlaneInfo>::NewCapacity(ON_SimpleArray<ON_ClippingPlaneInfo> *this)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  
  uVar1 = this->m_count;
  if ((7 < (long)(int)uVar1) && (0x10000000 < (ulong)((long)(int)uVar1 * 0x38))) {
    uVar2 = 0x49249a;
    if (uVar1 < 0x49249a) {
      uVar2 = uVar1;
    }
    return uVar2 + uVar1;
  }
  iVar3 = 4;
  if (2 < (int)uVar1) {
    iVar3 = uVar1 * 2;
  }
  return iVar3;
}

Assistant:

int ON_SimpleArray<T>::NewCapacity() const
{
  // Note: 
  //   This code appears in ON_SimpleArray<T>::NewCapacity()
  //   and ON_ClassArray<T>::NewCapacity().  Changes made to
  //   either function should be made to both functions.
  //   Because this code is template code that has to
  //   support dynamic linking and the code is defined
  //   in a header, I'm using copy-and-paste rather
  //   than a static.

  // This function returns 2*m_count unless that will
  // result in an additional allocation of more than
  // cap_size bytes.  The cap_size concept was added in
  // January 2010 because some calculations on enormous
  // models were slightly underestimating the initial
  // Reserve() size and then wasting gigabytes of memory.

  // cap_size = 128 MB on 32-bit os, 256 MB on 64 bit os
  const size_t cap_size = 32*sizeof(void*)*1024*1024;
  if (m_count*sizeof(T) <= cap_size || m_count < 8)
    return ((m_count <= 2) ? 4 : 2*m_count);

  // Growing the array will increase the memory
  // use by more than cap_size.
  int delta_count = 8 + cap_size/sizeof(T);
  if ( delta_count > m_count )
    delta_count = m_count;
  return (m_count + delta_count);
}